

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O3

int m_mainloop(void)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  if (sys_quit != 1) {
    do {
      if (sched_useaudio == 2) {
        sys_initmidiqueue();
        while (dVar3 = pd_maininstance.pd_systime, sys_quit == 0) {
          sleep(1);
          if ((pd_maininstance.pd_systime == dVar3) &&
             (!NAN(pd_maininstance.pd_systime) && !NAN(dVar3))) {
            sys_lock();
            sys_pollgui();
            sched_tick();
            sys_unlock();
          }
          if (sys_idlehook != (_func_int *)0x0) {
            (*sys_idlehook)();
          }
        }
      }
      else {
        sys_lock();
        sys_initmidiqueue();
        while (sys_quit == 0) {
          sched_tick();
          if (sched_fastforward <= 0.0) {
            sys_pollgui();
            sys_pollmidiqueue();
            if (sys_quit != 0) break;
            do {
              sys_unlock();
              if (sched_useaudio == 0) {
                dVar3 = sys_getrealtime();
                dVar3 = (dVar3 - sched_referencerealtime) * 1000.0 +
                        (pd_maininstance.pd_systime - sched_referencelogicaltime) / -14112.0;
                if (20000.0 < dVar3) {
                  sched_referencerealtime = sys_getrealtime();
                  sched_referencelogicaltime = pd_maininstance.pd_systime;
                }
                uVar1 = (uint)(0.0 < dVar3);
              }
              else {
                uVar1 = sys_send_dacs();
              }
              if ((uVar1 != 1) && (iVar2 = sched_idletask(), iVar2 == 0 && sys_nosleep == 0)) {
                sys_microsleep();
              }
              sys_lock();
            } while (uVar1 == 0 && sys_quit == 0);
          }
          else {
            sched_fastforward =
                 ((float)(pd_maininstance.pd_stuff)->st_schedblocksize /
                 (pd_maininstance.pd_stuff)->st_dacsr) * -1.4112e+07 + sched_fastforward;
            sched_referencerealtime = sys_getrealtime();
            sched_referencelogicaltime = pd_maininstance.pd_systime;
          }
        }
        sys_unlock();
      }
      if (sys_quit == 2) {
        sys_quit = 0;
        iVar2 = audio_isopen();
        if (iVar2 != 0) {
          sys_close_audio();
          sys_reopen_audio();
        }
      }
    } while (sys_quit != 1);
  }
  return 0;
}

Assistant:

int m_mainloop(void)
{
    while (sys_quit != SYS_QUIT_QUIT)
    {
        if (sched_useaudio == SCHED_AUDIO_CALLBACK)
            m_callbackscheduler();
        else m_pollingscheduler();
        if (sys_quit == SYS_QUIT_RESTART)
        {
            sys_quit = 0;
            if (audio_isopen())
            {
                sys_close_audio();
                sys_reopen_audio();
            }
        }
    }
    return (0);
}